

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::a64::ARMRAPass::_rewrite(ARMRAPass *this,BaseNode *first,BaseNode *stop)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  Error EVar4;
  uint32_t uVar5;
  VirtReg **ppVVar6;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  Error _err_2;
  Error _err_1;
  uint64_t absOffset;
  InstId arithInstId;
  GpX base;
  GpX dst;
  int64_t offset_1;
  BaseMem mem_1;
  int32_t offset;
  RAStackSlot *slot;
  RAWorkReg *workReg;
  VirtReg *virtReg;
  uint32_t virtIndex;
  BaseMem *mem;
  Operand *op;
  BaseNode *prev;
  Error _err;
  RABlock *block;
  uint32_t outId;
  BitWordIterator<unsigned_int> outIt;
  uint32_t useId;
  BitWordIterator<unsigned_int> useIt;
  RATiedReg *tiedReg;
  uint32_t tiedCount;
  RATiedReg *tiedRegs;
  uint32_t i;
  uint32_t opCount;
  Operand *operands;
  RAInst *raInst;
  InstNode *inst;
  BaseNode *next;
  BaseNode *node;
  uint32_t virtCount;
  Operand_ *in_stack_fffffffffffff678;
  BaseRAPass *in_stack_fffffffffffff680;
  Error in_stack_fffffffffffff688;
  Error in_stack_fffffffffffff68c;
  BaseBuilder *in_stack_fffffffffffff690;
  BaseBuilder *in_stack_fffffffffffff698;
  undefined4 local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  Error local_90c;
  ulong local_908;
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  ulong local_8f0;
  undefined4 local_8e4;
  undefined4 local_8e0;
  uint local_8dc;
  undefined4 local_8d8;
  Error local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  BaseBuilder *local_8c0;
  BaseBuilder *local_8b8;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  uint32_t local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  BaseBuilder *local_878;
  undefined8 local_86c;
  undefined8 local_864;
  int local_85c;
  RAStackSlot *local_858;
  char *local_850;
  VirtReg *local_848;
  uint local_83c;
  uint *local_838;
  uint *local_830;
  undefined8 local_828;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  long local_808;
  uint local_800;
  int local_7fc;
  uint local_7f8;
  int local_7f4;
  long local_7f0;
  uint local_7e4;
  long local_7e0;
  uint local_7d8;
  uint local_7d4;
  undefined8 *local_7d0;
  long *local_7c8;
  undefined8 *local_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  uint local_7a4;
  undefined8 *local_7a0;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  uint local_75c;
  Operand *local_758;
  Operand *local_750;
  uint *local_748;
  uint *local_740;
  undefined8 *local_738;
  uint *local_730;
  undefined8 local_728;
  long local_720;
  undefined8 local_718;
  long local_710;
  undefined8 local_708;
  long local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  Operand *local_6d8;
  long local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  long *local_668;
  long *local_660;
  long local_658;
  int local_64c;
  int *local_648;
  int local_63c;
  int *local_638;
  long local_630;
  int *local_628;
  int *local_620;
  long local_618;
  long local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  long *local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  undefined4 *local_5d0;
  undefined8 local_5c8;
  long local_5c0;
  Operand *local_5b8;
  uint *local_5b0;
  uint local_5a4;
  long local_5a0;
  VirtReg *local_598;
  char *in_stack_fffffffffffffa70;
  uint in_stack_fffffffffffffa7c;
  uint *in_stack_fffffffffffffa80;
  uint local_53c;
  undefined8 *local_538;
  undefined4 local_52c;
  undefined8 *local_528;
  undefined4 local_51c;
  undefined8 *local_518;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  BaseBuilder **local_500;
  undefined4 *local_4f8;
  uint local_4ec;
  undefined8 *local_4e8;
  undefined4 local_4e0;
  uint32_t local_4dc;
  undefined4 *local_4d8;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 *local_4c8;
  BaseBuilder **local_4c0;
  undefined4 local_4b4;
  undefined8 *local_4b0;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  BaseBuilder **local_498;
  undefined4 *local_490;
  undefined4 local_488;
  undefined4 local_484;
  undefined4 local_480;
  undefined4 local_47c;
  ulong *local_478;
  undefined4 *local_470;
  undefined4 local_468;
  undefined4 local_464;
  undefined4 local_460;
  undefined4 local_45c;
  ulong *local_458;
  undefined4 *local_450;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  BaseBuilder **local_438;
  undefined4 *local_430;
  undefined4 *local_428;
  undefined4 *local_420;
  undefined4 *local_418;
  undefined4 local_40c;
  long local_408;
  undefined4 *local_400;
  Operand *local_3f8;
  undefined4 local_3ec;
  BaseRAPass *local_3e8;
  uint *local_3e0;
  uint *local_3d8;
  Operand *local_3d0;
  Operand *local_3c8;
  uint *local_3c0;
  uint *local_3b8;
  Operand *local_3b0;
  uint *local_3a8;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined4 local_36c;
  undefined4 *local_368;
  undefined4 *local_360;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 *local_348;
  undefined4 *local_340;
  undefined4 local_334;
  uint local_330;
  undefined4 local_32c;
  undefined4 *local_328;
  undefined4 *local_320;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 *local_308;
  undefined4 *local_300;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined4 local_2ec;
  undefined4 *local_2e8;
  undefined4 *local_2e0;
  undefined4 *local_2d8;
  undefined4 *local_2d0;
  undefined4 local_2c4;
  undefined4 *local_2c0;
  undefined4 *local_2b8;
  undefined4 local_2ac;
  undefined4 *local_2a8;
  undefined4 *local_2a0;
  undefined4 local_294;
  undefined4 *local_290;
  undefined4 *local_288;
  undefined4 local_27c;
  undefined4 *local_278;
  undefined4 *local_270;
  undefined4 local_268;
  undefined1 local_261;
  undefined8 *local_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 *local_250;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 *local_230;
  undefined4 *local_228;
  uint local_21c;
  uint *local_218;
  uint *local_210;
  uint *local_208;
  undefined4 local_1fc;
  uint *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined4 local_1cc;
  undefined8 *local_1c8;
  uint local_1c0;
  undefined4 local_1bc;
  undefined8 *local_1b8;
  uint local_1b0;
  undefined4 local_1ac;
  uint *local_1a8;
  undefined4 local_19c;
  uint *local_198;
  undefined4 local_18c;
  undefined8 *local_188;
  undefined4 local_17c;
  undefined8 *local_178;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  BaseBuilder *local_148;
  ulong local_140;
  ulong local_138;
  BaseBuilder *local_130;
  BaseBuilder *local_128;
  undefined8 local_120;
  ulong local_118;
  ulong local_110;
  BaseBuilder *local_108;
  BaseBuilder *local_100;
  undefined4 local_f4;
  undefined4 *local_f0;
  undefined4 *local_e8;
  uint32_t local_dc;
  undefined4 *local_d8;
  undefined4 *local_d0;
  uint32_t local_c4;
  undefined4 *local_c0;
  undefined4 *local_b8;
  uint32_t local_ac;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 local_94;
  undefined4 local_90;
  uint32_t local_8c;
  undefined4 *local_88;
  undefined4 *local_80;
  undefined4 local_74;
  undefined4 *local_70;
  undefined4 *local_68;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 *local_50;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  Operand *local_8;
  
  local_690 = in_RDI[1] + 0x1e8;
  local_7a4 = *(uint *)(in_RDI[1] + 0x1f0);
  local_7b0 = in_RSI;
  local_7a0 = in_RDX;
  do {
    if (local_7b0 == local_7a0) {
      return 0;
    }
    local_688 = local_7b0;
    local_7b8 = (undefined8 *)local_7b0[1];
    local_680 = local_7b0;
    local_260 = local_7b0;
    local_261 = 0x20;
    bVar3 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                      (*(NodeFlags *)((long)local_7b0 + 0x11),kActsAsInst);
    if (bVar3) {
      local_678 = local_7b0;
      local_7c0 = local_7b0;
      local_670 = local_7b0;
      local_7c8 = (long *)local_7b0[4];
      local_768 = local_7b0;
      local_7d0 = local_7b0 + 8;
      local_770 = local_7b0;
      local_7d4 = (uint)*(byte *)((long)local_7b0 + 0x12);
      if (local_7c8 != (long *)0x0) {
        local_7e0 = (long)local_7c8 + 0x4c;
        local_7e4 = *(uint *)(local_7c8 + 2);
        local_668 = local_7c8;
        local_660 = local_7c8;
        for (local_7d8 = 0; local_7d8 < local_7e4; local_7d8 = local_7d8 + 1) {
          local_7f0 = local_7e0 + (ulong)local_7d8 * 0x20;
          local_64c = *(int *)(local_7f0 + 0x18);
          local_648 = &local_7f4;
          local_7f8 = (uint)*(byte *)(local_7f0 + 0xe);
          local_658 = local_7f0;
          local_630 = local_7f0;
          local_7f4 = local_64c;
          while (local_620 = &local_7f4, local_7f4 != 0) {
            Support::BitWordIterator<unsigned_int>::next
                      ((BitWordIterator<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
            InstNode::rewriteIdAtIndex
                      ((InstNode *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                       (uint32_t)((ulong)in_stack_fffffffffffff680 >> 0x20),
                       (uint32_t)in_stack_fffffffffffff680);
          }
          local_618 = local_7f0;
          local_63c = *(int *)(local_7f0 + 0x1c);
          local_638 = &local_7fc;
          local_610 = local_7f0;
          local_800 = (uint)*(byte *)(local_7f0 + 0xf);
          local_7fc = local_63c;
          while (local_628 = &local_7fc, local_7fc != 0) {
            Support::BitWordIterator<unsigned_int>::next
                      ((BitWordIterator<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
            InstNode::rewriteIdAtIndex
                      ((InstNode *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                       (uint32_t)((ulong)in_stack_fffffffffffff680 >> 0x20),
                       (uint32_t)in_stack_fffffffffffff680);
          }
        }
        local_608 = local_7b0;
        local_7b0[4] = 0;
        local_5f8 = local_7b0;
        if ((*(char *)(local_7b0 + 2) != '\x01') &&
           (local_600 = local_7b0, *(char *)(local_7b0 + 2) == '\x11')) {
          local_5f0 = local_7c8;
          local_808 = *local_7c8;
          local_5e0 = in_RDI[0x13];
          bVar3 = BaseRAPass::isNextTo
                            (in_stack_fffffffffffff680,(BaseNode *)in_stack_fffffffffffff678,
                             (BaseNode *)0x1a05e0);
          if (!bVar3) {
            local_700 = in_RDI[1];
            local_6e0 = local_7b0;
            local_708 = *local_7b0;
            *(undefined8 *)(local_700 + 0x198) = local_708;
            local_5e8 = in_RDI[0x13];
            local_5d8 = *(long *)(local_5e8 + 0x338);
            local_5d0 = &local_81c;
            local_254 = *(undefined4 *)(local_5d8 + 0x30);
            local_250 = &local_81c;
            local_244 = 5;
            local_240 = 5;
            local_258 = 5;
            local_230 = &local_258;
            local_238 = 0;
            local_23c = 0;
            local_81c = 5;
            local_814 = 0;
            local_810 = 0;
            local_234 = local_254;
            local_228 = local_250;
            local_818 = local_254;
            EVar4 = (**(code **)(*in_RDI + 0x68))(in_RDI,&local_81c);
            if (EVar4 != 0) {
              return EVar4;
            }
            local_80c = 0;
          }
          local_6e8 = local_7b0;
          local_828 = *local_7b0;
          BaseBuilder::removeNode(in_stack_fffffffffffff698,(BaseNode *)in_stack_fffffffffffff690);
          local_5c0 = local_808;
          local_5c8 = local_828;
          *(undefined8 *)(local_808 + 0x18) = local_828;
        }
      }
      for (local_7d8 = 0; local_7d8 < local_7d4; local_7d8 = local_7d8 + 1) {
        local_830 = (uint *)(local_7d0 + (ulong)local_7d8 * 2);
        local_748 = local_830;
        local_3d8 = local_830;
        local_3c0 = local_830;
        local_3b8 = local_830;
        if (((*local_830 & 7) == 2) &&
           (local_838 = local_830, local_740 = local_830, local_5b0 = local_830,
           local_3a8 = local_830, (*local_830 & 0x2000) != 0)) {
          local_75c = local_830[1];
          local_83c = local_75c - 0x100;
          local_730 = local_830;
          if (local_7a4 <= local_83c) {
            EVar4 = DebugUtils::errored(0x1e);
            return EVar4;
          }
          local_5a0 = in_RDI[1];
          local_5a4 = local_83c;
          ppVVar6 = ZoneVector<asmjit::v1_14::VirtReg_*>::operator[]
                              ((ZoneVector<asmjit::v1_14::VirtReg_*> *)
                               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                               (size_t)in_stack_fffffffffffff680);
          local_848 = *ppVVar6;
          local_850 = *(char **)(local_848 + 0x28);
          local_598 = local_848;
          if (local_850 == (char *)0x0) {
            DebugUtils::assertionFailed
                      ((char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c,
                       in_stack_fffffffffffffa70);
          }
          local_858 = *(RAStackSlot **)(local_850 + 0x18);
          in_stack_fffffffffffffa70 = local_850;
          local_85c = RAStackSlot::offset(local_858);
          in_stack_fffffffffffffa80 = local_838;
          local_210 = (uint *)(in_RDI + 0x3b);
          uVar1 = *local_210;
          local_208 = local_210;
          uVar5 = RAStackSlot::baseRegId(local_858);
          in_stack_fffffffffffffa7c =
               CONCAT13((char)(uVar1 >> 3),(int3)in_stack_fffffffffffffa7c) & 0x1fffffff;
          local_21c = in_stack_fffffffffffffa7c >> 0x18;
          local_218 = in_stack_fffffffffffffa80;
          *in_stack_fffffffffffffa80 = *in_stack_fffffffffffffa80 & 0xffffff07 | local_21c << 3;
          in_stack_fffffffffffffa80[1] = uVar5;
          local_1f8 = local_838;
          local_1fc = 0xffffdfff;
          *local_838 = *local_838 & 0xffffdfff;
          local_838[3] = local_85c + local_838[3];
        }
      }
      local_780 = local_7c0;
      local_3e0 = (uint *)(local_7c0 + 6);
      if ((((*local_3e0 & 0xffff) == 6) &&
          (local_778 = local_7c0, *(char *)((long)local_7c0 + 0x12) == '\x02')) &&
         (local_750 = InstNode::op((InstNode *)
                                   CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                                   (uint32_t)((ulong)in_stack_fffffffffffff680 >> 0x20)),
         local_3d0 = local_750, local_3c8 = local_750, local_3b0 = local_750,
         ((local_750->super_Operand_)._signature._bits & 7) == 2)) {
        local_5b8 = InstNode::op((InstNode *)
                                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                                 (uint32_t)((ulong)in_stack_fffffffffffff680 >> 0x20));
        local_86c._0_4_ = (local_5b8->super_Operand_)._signature;
        local_86c._4_4_ = (local_5b8->super_Operand_)._baseId;
        uVar2 = *(undefined8 *)(local_5b8->super_Operand_)._data;
        local_1f0 = &local_86c;
        local_864._4_4_ = (int)((ulong)uVar2 >> 0x20);
        if (((uint)(undefined4)local_86c >> 3 & 0x1f) == 0) {
          in_stack_fffffffffffff698 = (BaseBuilder *)CONCAT44(local_86c._4_4_,local_864._4_4_);
        }
        else {
          in_stack_fffffffffffff698 = (BaseBuilder *)(long)local_864._4_4_;
        }
        local_538 = &local_86c;
        local_1bc = 0x1ff8;
        local_53c = (undefined4)local_86c & 0x1ff8;
        local_198 = &local_53c;
        local_19c = 0;
        local_878 = in_stack_fffffffffffff698;
        local_1e8 = local_1f0;
        local_1e0 = local_1f0;
        local_1d8 = local_1f0;
        local_1b8 = local_538;
        local_1b0 = local_53c;
        local_864 = uVar2;
        if ((local_86c & 0x1ff8) == 0) {
          local_518 = local_7c0;
          local_51c = 0xf4;
          local_188 = local_7c0 + 6;
          local_18c = 0xf4;
          *(undefined4 *)local_188 = 0xf4;
          local_4f8 = &local_888;
          local_500 = &local_878;
          local_504 = 0;
          local_37c = 4;
          local_378 = 4;
          local_50c = 4;
          local_150 = 0;
          local_510 = 0;
          local_270 = &local_50c;
          local_278 = &local_510;
          local_508 = 4;
          local_2f0 = SUB84(in_stack_fffffffffffff698,0);
          local_2e8 = &local_508;
          local_2ec = 0;
          local_2f4 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
          local_888 = 4;
          local_884 = 0;
          local_2e0 = local_4f8;
          local_268 = local_508;
          local_14c = local_510;
          local_128 = in_stack_fffffffffffff698;
          local_100 = in_stack_fffffffffffff698;
          local_880 = local_2f0;
          local_87c = local_2f4;
          InstNode::setOp((InstNode *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
                          (Operand_ *)in_stack_fffffffffffff680);
        }
        else {
          local_4e8 = &local_86c;
          local_1cc = 0x1f00;
          local_4ec = (undefined4)local_86c & 0x1f00;
          local_1a8 = &local_4ec;
          local_1ac = 0;
          local_1c8 = local_4e8;
          local_1c0 = local_4ec;
          if ((local_86c & 0x1f00) != 0) {
            EVar4 = DebugUtils::errored(0x2c);
            return EVar4;
          }
          local_758 = InstNode::op((InstNode *)
                                   CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                                   (uint32_t)((ulong)in_stack_fffffffffffff680 >> 0x20));
          local_4dc = (local_758->super_Operand_)._baseId;
          local_4d8 = &local_898;
          local_4e0 = 0x8000039;
          local_d8 = &local_4e0;
          local_90 = 0;
          local_94 = 0;
          local_898 = 0x8000039;
          local_890 = 0;
          local_88c = 0;
          local_738 = &local_86c;
          local_4cc = local_86c._4_4_;
          local_4c8 = &local_8a8;
          local_4d0 = 0x8000039;
          local_f0 = &local_4d0;
          local_40 = 0;
          local_44 = 0;
          local_8a8 = 0x8000039;
          local_8a4 = local_86c._4_4_;
          local_8a0 = 0;
          local_89c = 0;
          local_8ac = 3;
          in_stack_fffffffffffff690 = local_878;
          if ((long)local_878 < 0) {
            local_8ac = 0x174;
            local_8c0 = local_878;
            local_4c0 = &local_8c0;
            in_stack_fffffffffffff690 = (BaseBuilder *)-(long)local_878;
          }
          local_528 = local_7c0;
          local_178 = local_7c0 + 6;
          *(undefined4 *)local_178 = local_8ac;
          local_4b0 = local_7c0;
          local_4b4 = 3;
          *(undefined1 *)((long)local_7c0 + 0x12) = 3;
          local_8b8 = in_stack_fffffffffffff690;
          local_6d8 = local_758;
          local_52c = local_8ac;
          local_17c = local_8ac;
          local_f4 = local_4cc;
          local_e8 = local_4c8;
          local_dc = local_4dc;
          local_d0 = local_4d8;
          local_c4 = local_4dc;
          local_c0 = local_d8;
          local_b8 = local_4d8;
          local_ac = local_4dc;
          local_a8 = local_d8;
          local_a0 = local_4d8;
          local_8c = local_4dc;
          local_88 = local_d8;
          local_80 = local_4d8;
          local_74 = local_4cc;
          local_70 = local_f0;
          local_68 = local_4c8;
          local_5c = local_4cc;
          local_58 = local_f0;
          local_50 = local_4c8;
          local_3c = local_4cc;
          local_38 = local_f0;
          local_30 = local_4c8;
          local_894 = local_4dc;
          InstNode::setOp((InstNode *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
                          (Operand_ *)in_stack_fffffffffffff680);
          local_490 = &local_8d0;
          local_498 = &local_8b8;
          local_49c = 0;
          local_384 = 4;
          local_380 = 4;
          local_4a4 = 4;
          local_158 = 0;
          local_4a8 = 0;
          local_288 = &local_4a4;
          local_290 = &local_4a8;
          local_4a0 = 4;
          local_130 = local_8b8;
          local_310 = SUB84(local_8b8,0);
          local_108 = local_8b8;
          local_308 = &local_4a0;
          local_30c = 0;
          local_314 = (undefined4)((ulong)local_8b8 >> 0x20);
          local_8d0 = 4;
          local_8cc = 0;
          local_300 = local_490;
          local_27c = local_4a0;
          local_154 = local_4a8;
          local_8c8 = local_310;
          local_8c4 = local_314;
          InstNode::setOp((InstNode *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
                          (Operand_ *)in_stack_fffffffffffff680);
          if (((BaseBuilder *)0xfff < local_8b8) && (((ulong)local_8b8 & 0xffffffffff000fff) != 0))
          {
            if (local_8b8 < (BaseBuilder *)0x1000000) {
              local_710 = in_RDI[1];
              local_6f0 = local_7c0;
              local_718 = *local_7c0;
              *(undefined8 *)(local_710 + 0x198) = local_718;
              local_408 = in_RDI[1];
              local_330 = (uint)local_8b8 & 0xfff;
              local_8f0 = (ulong)local_330;
              local_470 = &local_8e4;
              local_478 = &local_8f0;
              local_47c = 0;
              local_38c = 4;
              local_388 = 4;
              local_484 = 4;
              local_160 = 0;
              local_488 = 0;
              local_2a0 = &local_484;
              local_2a8 = &local_488;
              local_480 = 4;
              local_328 = &local_480;
              local_32c = 0;
              local_334 = 0;
              local_8e4 = 4;
              local_8e0 = 0;
              local_8d8 = 0;
              local_40c = local_8ac;
              local_418 = &local_898;
              local_420 = &local_8a8;
              local_428 = local_470;
              local_320 = local_470;
              local_294 = local_480;
              local_15c = local_488;
              local_138 = local_8f0;
              local_110 = local_8f0;
              local_28 = local_420;
              local_20 = local_418;
              local_10 = local_470;
              local_8dc = local_330;
              in_stack_fffffffffffff68c =
                   BaseEmitter::_emitI(&in_stack_fffffffffffff690->super_BaseEmitter,
                                       in_stack_fffffffffffff68c,
                                       (Operand_ *)in_stack_fffffffffffff680,
                                       in_stack_fffffffffffff678,(Operand_ *)0x1a187f);
              if (in_stack_fffffffffffff68c != 0) {
                return in_stack_fffffffffffff68c;
              }
              local_8d4 = in_stack_fffffffffffff68c;
              InstNode::setOp((InstNode *)in_stack_fffffffffffff690,0,
                              (Operand_ *)in_stack_fffffffffffff680);
              local_908 = (ulong)local_8b8 & 0xfff000;
              local_450 = &local_900;
              local_458 = &local_908;
              local_45c = 0;
              local_394 = 4;
              local_390 = 4;
              local_464 = 4;
              local_168 = 0;
              local_468 = 0;
              local_2b8 = &local_464;
              local_2c0 = &local_468;
              local_460 = 4;
              local_350 = (undefined4)local_908;
              local_348 = &local_460;
              local_34c = 0;
              local_354 = 0;
              local_900 = 4;
              local_8fc = 0;
              local_340 = local_450;
              local_2ac = local_460;
              local_164 = local_468;
              local_140 = local_908;
              local_118 = local_908;
              local_8f8 = local_350;
              local_8f4 = local_354;
              InstNode::setOp((InstNode *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
                              (Operand_ *)in_stack_fffffffffffff680);
            }
            else {
              local_720 = in_RDI[1];
              local_6f8 = local_7c0;
              local_728 = *local_7c0;
              *(undefined8 *)(local_720 + 0x198) = local_728;
              in_stack_fffffffffffff680 = (BaseRAPass *)in_RDI[1];
              local_3f8 = InstNode::op((InstNode *)
                                       CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688)
                                       ,(uint32_t)((ulong)in_stack_fffffffffffff680 >> 0x20));
              local_430 = &local_91c;
              local_438 = &local_8b8;
              local_43c = 0;
              local_39c = 4;
              local_398 = 4;
              local_444 = 4;
              local_170 = 0;
              local_448 = 0;
              local_2d0 = &local_444;
              local_2d8 = &local_448;
              local_440 = 4;
              local_148._0_4_ = SUB84(local_8b8,0);
              local_120._4_4_ = (undefined4)((ulong)local_8b8 >> 0x20);
              local_368 = &local_440;
              local_36c = 0;
              local_370 = local_148._0_4_;
              local_374 = local_120._4_4_;
              local_91c = 4;
              local_918 = 0;
              local_914 = local_148._0_4_;
              local_910 = local_120._4_4_;
              local_3ec = 0xf4;
              local_400 = local_430;
              local_3e8 = in_stack_fffffffffffff680;
              local_360 = local_430;
              local_2c4 = local_440;
              local_16c = local_448;
              local_148 = local_8b8;
              local_120 = local_8b8;
              local_18 = local_430;
              local_8 = local_3f8;
              in_stack_fffffffffffff688 =
                   BaseEmitter::_emitI(&in_stack_fffffffffffff690->super_BaseEmitter,
                                       in_stack_fffffffffffff68c,
                                       (Operand_ *)in_stack_fffffffffffff680,
                                       in_stack_fffffffffffff678);
              if (in_stack_fffffffffffff688 != 0) {
                return in_stack_fffffffffffff688;
              }
              local_90c = in_stack_fffffffffffff688;
              InstNode::setOp((InstNode *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
                              (Operand_ *)in_stack_fffffffffffff680);
              InstNode::setOp((InstNode *)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
                              (Operand_ *)in_stack_fffffffffffff680);
            }
          }
        }
      }
    }
    local_7b0 = local_7b8;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error ARMRAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // If the instruction contains pass data (raInst) then it was a subject
        // for register allocation and must be rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext())
            inst->rewriteIdAtIndex(useIt.next(), useId);

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext())
            inst->rewriteIdAtIndex(outIt.next(), outId);
        }

        // This data is allocated by Zone passed to `runOnFunction()`, which
        // will be reset after the RA pass finishes. So reset this data to
        // prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit
          // label is next to it (optimization) or patched to an architecture
          // dependent jump instruction that jumps to the function's exit before
          // the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }

      // Rewrite `loadAddressOf()` construct.
      if (inst->realId() == Inst::kIdAdr && inst->opCount() == 2 && inst->op(1).isMem()) {
        BaseMem mem = inst->op(1).as<BaseMem>();
        int64_t offset = mem.offset();

        if (!mem.hasBaseOrIndex()) {
          inst->setId(Inst::kIdMov);
          inst->setOp(1, Imm(offset));
        }
        else {
          if (mem.hasIndex())
            return DebugUtils::errored(kErrorInvalidAddressIndex);

          GpX dst(inst->op(0).as<Gp>().id());
          GpX base(mem.baseId());

          InstId arithInstId = offset < 0 ? Inst::kIdSub : Inst::kIdAdd;
          uint64_t absOffset = offset < 0 ? Support::neg(uint64_t(offset)) : uint64_t(offset);

          inst->setId(arithInstId);
          inst->setOpCount(3);
          inst->setOp(1, base);
          inst->setOp(2, Imm(absOffset));

          // Use two operations if the offset cannot be encoded with ADD/SUB.
          if (absOffset > 0xFFFu && (absOffset & ~uint64_t(0xFFF000u)) != 0) {
            if (absOffset <= 0xFFFFFFu) {
              cc()->_setCursor(inst->prev());
              ASMJIT_PROPAGATE(cc()->emit(arithInstId, dst, base, Imm(absOffset & 0xFFFu)));

              inst->setOp(1, dst);
              inst->setOp(2, Imm(absOffset & 0xFFF000u));
            }
            else {
              cc()->_setCursor(inst->prev());
              ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, inst->op(0), Imm(absOffset)));

              inst->setOp(1, base);
              inst->setOp(2, dst);
            }
          }
        }
      }
    }

    node = next;
  }

  return kErrorOk;
}